

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackDebGenerator::PackageOnePack
          (cmCPackDebGenerator *this,string *initialTopLevel,string *packageName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  string *__lhs;
  undefined4 extraout_var;
  ostream *poVar3;
  uint uVar4;
  allocator<char> local_239;
  cmAlphaNum local_238;
  string component_path;
  string outputFileName;
  string packageFileName;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string((string *)&localToplevel,(string *)initialTopLevel);
  cmsys::SystemTools::GetParentDirectory(&packageFileName,&(this->super_cmCPackGenerator).toplevel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component_path,"CPACK_PACKAGE_FILE_NAME",&local_239);
  __lhs = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&component_path);
  if (__lhs == (string *)0x0) {
    __lhs = &cmValue::Empty_abi_cxx11_;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 __lhs,"-");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                 packageName);
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::operator+(&outputFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&component_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",packageName);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&local_238);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&outputFileName);
  std::__cxx11::string::append((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_NAME",(allocator<char> *)&local_238);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&outputFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)&local_238);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&packageFileName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_DEB_PACKAGE_COMPONENT",(allocator<char> *)&local_238);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,(cmValue)packageName);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  _cmCPackLog_msg = (pointer)0x1;
  local_238.View_._M_str = (packageName->_M_dataplus)._M_p;
  local_238.View_._M_len = packageName->_M_string_length;
  cmStrCat<>(&component_path,(cmAlphaNum *)&cmCPackLog_msg,&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
             (allocator<char> *)&local_238);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&component_path);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  bVar1 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar1) {
    bVar1 = createDebPackages(this);
    uVar4 = (uint)bVar1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Error while execution CPackDeb.cmake");
    std::endl<char,std::char_traits<char>>(poVar3);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x231,(char *)local_238.View_._M_len);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar4 = 0;
  }
  std::__cxx11::string::~string((string *)&component_path);
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&packageFileName);
  std::__cxx11::string::~string((string *)&localToplevel);
  return uVar4;
}

Assistant:

int cmCPackDebGenerator::PackageOnePack(std::string const& initialTopLevel,
                                        std::string const& packageName)
{
  // Begin the archive for this pack
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             "-" + packageName + this->GetOutputExtension());

  localToplevel += "/" + packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);
  // Tell CPackDeb.cmake the name of the component GROUP.
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT", packageName);
  // Tell CPackDeb.cmake the path where the component is.
  std::string component_path = cmStrCat('/', packageName);
  this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}